

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# types.cpp
# Opt level: O2

bool __thiscall libcellml::UnitsItem::isValid(UnitsItem *this)

{
  ulong uVar1;
  size_t sVar2;
  bool bVar3;
  shared_ptr<libcellml::Units> units;
  __shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2> local_20;
  
  std::__shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_20,this->mPimpl);
  if (local_20._M_ptr == (Units *)0x0) {
    bVar3 = false;
  }
  else {
    uVar1 = this->mPimpl->mIndex;
    sVar2 = Units::unitCount(local_20._M_ptr);
    bVar3 = uVar1 < sVar2;
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_20._M_refcount);
  return bVar3;
}

Assistant:

bool UnitsItem::isValid() const
{
    auto units = mPimpl->mUnits.lock();
    if (units != nullptr) {
        return mPimpl->mIndex < units->unitCount();
    }

    return false;
}